

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O2

void __thiscall wasm::CodePushing::visitBlock(CodePushing *this,Block *curr)

{
  undefined1 local_68 [8];
  Pusher pusher;
  
  if (1 < (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements) {
    Pusher::Pusher((Pusher *)local_68,curr,&this->analyzer,&this->numGetsSoFar,
                   &((this->
                     super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                     ).super_Pass.runner)->options,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
                   ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                   super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
                   currModule);
    std::
    _Hashtable<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&pusher.module);
  }
  return;
}

Assistant:

void visitBlock(Block* curr) {
    // Pushing code only makes sense if we are size 2 or above: we need one
    // element to push and an element to push it into, at minimum.
    if (curr->list.size() < 2) {
      return;
    }
    // At this point in the postorder traversal we have gone through all our
    // children. Therefore any variable whose gets seen so far is equal to the
    // total gets must have no further users after this block. And therefore
    // when we see an SFA variable defined here, we know it isn't used before it
    // either, and has just this one assign. So we can push it forward while we
    // don't hit a non-control-flow ordering invalidation issue, since if this
    // isn't a loop, it's fine (we're not used outside), and if it is, we hit
    // the assign before any use (as we can't push it past a use).
    Pusher pusher(curr, analyzer, numGetsSoFar, getPassOptions(), *getModule());
  }